

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void SubtractionHelper<char,long,8>::
     SubtractThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (char *lhs,long *rhs,char *result)

{
  undefined1 uVar1;
  char cVar2;
  long lVar3;
  undefined1 *in_RDX;
  long *in_RSI;
  char *in_RDI;
  int64_t tmp;
  
  lVar3 = (long)*in_RDI - *in_RSI;
  uVar1 = (undefined1)lVar3;
  if (*in_RDI < '\0') {
    if (*in_RSI < 0) {
      cVar2 = std::numeric_limits<char>::max();
      if (lVar3 <= cVar2) {
        *in_RDX = uVar1;
        return;
      }
    }
    else if ((lVar3 <= *in_RDI) && (cVar2 = std::numeric_limits<char>::min(), cVar2 <= lVar3)) {
      *in_RDX = uVar1;
      return;
    }
  }
  else if (*in_RSI < 0) {
    if ((*in_RDI <= lVar3) && (cVar2 = std::numeric_limits<char>::max(), lVar3 <= cVar2)) {
      *in_RDX = uVar1;
      return;
    }
  }
  else {
    cVar2 = std::numeric_limits<char>::min();
    if (cVar2 <= lVar3) {
      *in_RDX = uVar1;
      return;
    }
  }
  safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnOverflow();
}

Assistant:

SAFEINT_CONSTEXPR14 static void SubtractThrow( const T& lhs, const U& rhs, T& result ) SAFEINT_CPP_THROW
    {
        // lhs is a 32-bit int or less, rhs std::int64_t
        // we have essentially 4 cases:
        //
        // lhs positive, rhs positive - rhs could be larger than lhs can represent
        // lhs positive, rhs negative - additive case - check tmp >= lhs and tmp > max int
        // lhs negative, rhs positive - check tmp <= lhs and tmp < min int
        // lhs negative, rhs negative - addition cannot internally overflow, check against max

        std::int64_t tmp = (std::int64_t)((std::uint64_t)lhs - (std::uint64_t)rhs);

        if( lhs >= 0 )
        {
            // first case
            if( rhs >= 0 )
            {
                if( tmp >= std::numeric_limits<T>::min() )
                {
                    result = (T)tmp;
                    return;
                }
            }
            else
            {
                // second case
                if( tmp >= lhs && tmp <= std::numeric_limits<T>::max() )
                {
                    result = (T)tmp;
                    return;
                }
            }
        }
        else
        {
            // lhs < 0
            // third case
            if( rhs >= 0 )
            {
                if( tmp <= lhs && tmp >= std::numeric_limits<T>::min() )
                {
                    result = (T)tmp;
                    return;
                }
            }
            else
            {
                // fourth case
                if( tmp <= std::numeric_limits<T>::max() )
                {
                    result = (T)tmp;
                    return;
                }
            }
        }

        E::SafeIntOnOverflow();
    }